

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

QStringList * parseIfMatch(QStringList *__return_storage_ptr__,QByteArrayView raw)

{
  bool bVar1;
  storage_type *psVar2;
  QLatin1String *element;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QByteArrayView QVar4;
  QArrayDataPointer<char16_t> local_c0;
  iterator __begin1;
  QByteArrayView local_68;
  QByteArrayView local_58;
  QStringTokenizerBase<QLatin1String,_QChar> local_48;
  long local_28;
  
  local_58.m_data = raw.m_data;
  local_58.m_size = raw.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = QByteArrayView::trimmed(&local_58);
  __begin1.tokenizer =
       (QStringTokenizerBase<QLatin1String,_QChar> *)QByteArrayView::lengthHelperCharArray("*",2);
  __begin1.current.value.m_size = (long)",en,*" + 4;
  bVar1 = comparesEqual(&local_68,(QByteArrayView *)&__begin1);
  if (bVar1) {
    __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)0x0;
    local_48.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_48.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
    local_48.m_haystack.m_size = 0;
    __begin1.current.value.m_size = (qsizetype)anon_var_dwarf_2bbba3;
    local_48.m_haystack.m_data = (storage_type *)0x0;
    __begin1.current.value.m_data = (char *)0x1;
    QList<QString>::QList<QString,void>(__return_storage_ptr__,(QString *)&__begin1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&__begin1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_48.m_haystack.m_size = local_68.m_size;
    local_48.m_haystack.m_data = local_68.m_data;
    local_48.m_needle.ucs = L',';
    __begin1.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.value.m_data = &DAT_aaaaaaaaaaaaaaaa;
    __begin1.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
    __begin1.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator(&__begin1,&local_48);
    while (__begin1.current.ok != false) {
      QVar3 = QLatin1String::trimmed(&__begin1.current.value);
      psVar2 = (storage_type *)QVar3.m_size;
      if (((psVar2 != (storage_type *)0x0) && (*QVar3.m_data == '\"')) &&
         ((QVar3.m_data + -1)[(long)psVar2] == '\"')) {
        QVar4.m_data = psVar2;
        QVar4.m_size = (qsizetype)&local_c0;
        QString::fromLatin1(QVar4);
        QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_c0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(&__begin1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList parseIfMatch(QByteArrayView raw)
{
    return parseMatchImpl(raw, [](QByteArrayView element) {
        return element.startsWith('"') && element.endsWith('"');
    });
}